

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

bool slang::ast::isValidForUserDefinedNet(Type *type)

{
  bool bVar1;
  Type *type_00;
  UnpackedStructType *pUVar2;
  iterator iVar3;
  reference ppFVar4;
  FieldSymbol *field_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3_1;
  FieldSymbol *field;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3;
  Type *ct;
  FieldSymbol *in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffb0;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_28;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *local_20;
  
  type_00 = Type::getCanonicalType(in_stack_ffffffffffffffb0);
  bVar1 = Type::isIntegral(in_stack_ffffffffffffffb0);
  if ((bVar1) || (bVar1 = Type::isFloating((Type *)0x730be0), bVar1)) {
    return true;
  }
  if ((type_00->super_Symbol).kind == FixedSizeUnpackedArrayType) {
    Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x730c04);
    bVar1 = isValidForUserDefinedNet(type_00);
    return bVar1;
  }
  bVar1 = Type::isUnpackedStruct((Type *)0x730c22);
  if (!bVar1) {
    bVar1 = Type::isUnpackedUnion((Type *)0x730cc9);
    if (!bVar1) {
      return false;
    }
    Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0x730cdc);
    iVar3 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                      ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                       in_stack_ffffffffffffffa8);
    iVar3 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                      (iVar3._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                          *)iVar3._M_current,
                         (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffffa8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return true;
      }
      ppFVar4 = __gnu_cxx::
                __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                ::operator*((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                             *)&stack0xffffffffffffffb8);
      in_stack_ffffffffffffffa8 = *ppFVar4;
      ValueSymbol::getType((ValueSymbol *)0x730d36);
      bVar1 = isValidForUserDefinedNet(type_00);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffffb8);
    }
    return false;
  }
  pUVar2 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x730c35);
  local_20 = &pUVar2->fields;
  local_28._M_current =
       (FieldSymbol **)
       std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffffa8);
  std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffffb8._M_current);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_28);
    ValueSymbol::getType((ValueSymbol *)0x730c91);
    bVar1 = isValidForUserDefinedNet(type_00);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  return false;
}

Assistant:

static bool isValidForUserDefinedNet(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isIntegral() || ct.isFloating())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType)
        return isValidForUserDefinedNet(ct.as<FixedSizeUnpackedArrayType>().elementType);

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    if (ct.isUnpackedUnion()) {
        for (auto field : ct.as<UnpackedUnionType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    return false;
}